

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
unitStrings_dotInterpretation_Test::TestBody(unitStrings_dotInterpretation_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  AssertHelper local_370;
  Message local_368;
  allocator local_359;
  string local_358;
  precise_unit local_338;
  precise_unit local_328;
  precise_unit local_318;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_7;
  Message local_2f0;
  allocator local_2e1;
  string local_2e0;
  precise_unit local_2c0;
  precise_unit local_2b0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_6;
  Message local_288;
  allocator local_279;
  string local_278;
  precise_unit local_258;
  precise_unit local_248;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_5;
  Message local_220;
  allocator local_211;
  string local_210;
  precise_unit local_1f0;
  precise_unit local_1e0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_4;
  Message local_1b8;
  allocator local_1a9;
  string local_1a8;
  precise_unit local_188;
  precise_unit local_178;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  allocator local_141;
  string local_140;
  precise_unit local_120;
  precise_unit local_110;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  allocator local_d9;
  string local_d8;
  precise_unit local_b8;
  precise_unit local_a8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  allocator local_61;
  string local_60;
  precise_unit local_40;
  precise_unit local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_dotInterpretation_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_30 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::m,(precise_unit *)units::precise::s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"m.s",&local_61);
  uVar2 = units::getDefaultFlags();
  local_40 = units::unit_from_string(&local_60,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"precise::m * precise::s","unit_from_string(\"m.s\")",&local_30,
             &local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xd4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_a8 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::milli,(precise_unit *)units::precise::s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"m. s",&local_d9);
  uVar2 = units::getDefaultFlags();
  local_b8 = units::unit_from_string(&local_d8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_98,"precise::milli * precise::s","unit_from_string(\"m. s\")",
             &local_a8,&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xd6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_110 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::milli,(precise_unit *)units::precise::s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"m. s.",&local_141);
  uVar2 = units::getDefaultFlags();
  local_120 = units::unit_from_string(&local_140,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_100,"precise::milli * precise::s","unit_from_string(\"m. s.\")",
             &local_110,&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xd8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_178 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::m,(precise_unit *)units::precise::s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"m- s",&local_1a9);
  uVar2 = units::getDefaultFlags();
  local_188 = units::unit_from_string(&local_1a8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_168,"precise::m * precise::s","unit_from_string(\"m- s\")",&local_178
             ,&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xda,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1e0 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::milli,(precise_unit *)units::precise::s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"m-s",&local_211);
  uVar2 = units::getDefaultFlags();
  local_1f0 = units::unit_from_string(&local_210,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1d0,"precise::milli * precise::s","unit_from_string(\"m-s\")",
             &local_1e0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_248 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::milli,(precise_unit *)units::precise::s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"m.s.",&local_279);
  uVar2 = units::getDefaultFlags();
  local_258 = units::unit_from_string(&local_278,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_238,"precise::milli * precise::s","unit_from_string(\"m.s.\")",
             &local_248,&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_2b0 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::milli,(precise_unit *)units::precise::s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,".m.s.",&local_2e1);
  uVar2 = units::getDefaultFlags();
  local_2c0 = units::unit_from_string(&local_2e0,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_2a0,"precise::milli * precise::s","unit_from_string(\".m.s.\")",
             &local_2b0,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_328 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::milli,(precise_unit *)units::precise::s);
  units::precise_unit::precise_unit(&local_318,0.9,&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_358,"0.9.m.s.",&local_359);
  uVar2 = units::getDefaultFlags();
  local_338 = units::unit_from_string(&local_358,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_308,"precise_unit(0.9, precise::milli * precise::s)",
             "unit_from_string(\"0.9.m.s.\")",&local_318,&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  return;
}

Assistant:

TEST(unitStrings, dotInterpretation)
{
    // interpret . as multiply
    EXPECT_EQ(precise::m * precise::s, unit_from_string("m.s"));
    // interpret as abbreviation so millisecond
    EXPECT_EQ(precise::milli * precise::s, unit_from_string("m. s"));
    // interpret as abbreviation so millisecond
    EXPECT_EQ(precise::milli * precise::s, unit_from_string("m. s."));
    // connector so space = multiply
    EXPECT_EQ(precise::m * precise::s, unit_from_string("m- s"));
    // connector so space = multiply
    EXPECT_EQ(precise::milli * precise::s, unit_from_string("m-s"));
    // s is abbreviation so first . is also abbreviation so millisecond
    EXPECT_EQ(precise::milli * precise::s, unit_from_string("m.s."));
    // s is abbreviation so first . is also abbreviation so millisecond
    EXPECT_EQ(precise::milli * precise::s, unit_from_string(".m.s."));

    // s is abbreviation so first . is also abbreviation so millisecond
    EXPECT_EQ(
        precise_unit(0.9, precise::milli * precise::s),
        unit_from_string("0.9.m.s."));
}